

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O0

double clock_gettimesincewithunits(double prevsystime,double units,int sampflag)

{
  int sampflag_local;
  double units_local;
  double prevsystime_local;
  
  if (sampflag == 0) {
    prevsystime_local = (pd_maininstance.pd_systime - prevsystime) / (units * 14112.0);
  }
  else {
    prevsystime_local =
         (pd_maininstance.pd_systime - prevsystime) /
         ((14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr) * units);
  }
  return prevsystime_local;
}

Assistant:

double clock_gettimesincewithunits(double prevsystime,
    double units, int sampflag)
{
            /* If in samples, divide TIMEUNITPERSECOND/sys_dacsr first (at
            cost of an extra division) since it's probably an integer and if
            units == 1 and (sys_time - prevsystime) is an integer number of
            DSP ticks, the result will be exact. */
    if (sampflag)
        return ((pd_this->pd_systime - prevsystime)/
            ((TIMEUNITPERSECOND/STUFF->st_dacsr)*units));
    else return ((pd_this->pd_systime - prevsystime)/(TIMEUNITPERMSEC*units));
}